

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

Iterator * leveldb::GetFileIterator(void *arg,ReadOptions *options,Slice *file_value)

{
  uint8_t *buffer;
  Iterator *pIVar1;
  Status local_30;
  Slice local_28;
  Slice local_18;
  
  if (file_value->size_ == 0x10) {
    pIVar1 = TableCache::NewIterator
                       ((TableCache *)arg,options,*(uint64_t *)file_value->data_,
                        *(uint64_t *)((long)file_value->data_ + 8),(Table **)0x0);
    return pIVar1;
  }
  local_18.data_ = "FileReader invoked with unexpected value";
  local_18.size_ = 0x28;
  local_28.data_ = "";
  local_28.size_ = 0;
  Status::Status(&local_30,kCorruption,&local_18,&local_28);
  pIVar1 = NewErrorIterator(&local_30);
  if (local_30.state_ != (char *)0x0) {
    operator_delete__(local_30.state_);
  }
  return pIVar1;
}

Assistant:

static Iterator* GetFileIterator(void* arg, const ReadOptions& options,
                                 const Slice& file_value) {
  TableCache* cache = reinterpret_cast<TableCache*>(arg);
  if (file_value.size() != 16) {
    return NewErrorIterator(
        Status::Corruption("FileReader invoked with unexpected value"));
  } else {
    return cache->NewIterator(options, DecodeFixed64(file_value.data()),
                              DecodeFixed64(file_value.data() + 8));
  }
}